

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O0

Cnf_Cut_t * Cnf_CutCreate(Cnf_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Dar_Cut_t *pCut_00;
  Cnf_Cut_t *pCut_01;
  uint *puVar2;
  uint *pTruth;
  Cnf_Cut_t *pCut;
  Dar_Cut_t *pCutBest;
  Aig_Obj_t *pObj_local;
  Cnf_Man_t *p_local;
  
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfCut.c"
                  ,0x5c,"Cnf_Cut_t *Cnf_CutCreate(Cnf_Man_t *, Aig_Obj_t *)");
  }
  pCut_00 = Dar_ObjBestCut(pObj);
  if (pCut_00 != (Dar_Cut_t *)0x0) {
    if (*(uint *)&pCut_00->field_0x4 >> 0x1d < 5) {
      pCut_01 = Cnf_CutAlloc(p,*(uint *)&pCut_00->field_0x4 >> 0x1d);
      memcpy(pCut_01 + 1,pCut_00->pLeaves,(ulong)(*(uint *)&pCut_00->field_0x4 >> 0x1d) << 2);
      puVar2 = Cnf_CutTruth(pCut_01);
      *puVar2 = *(int *)&pCut_00->field_0x4 << 0x10 | *(uint *)&pCut_00->field_0x4 & 0xffff;
      iVar1 = Cnf_CutSopCost(p,pCut_00);
      pCut_01->Cost = (char)iVar1;
      return pCut_01;
    }
    __assert_fail("pCutBest->nLeaves <= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfCut.c"
                  ,0x5f,"Cnf_Cut_t *Cnf_CutCreate(Cnf_Man_t *, Aig_Obj_t *)");
  }
  __assert_fail("pCutBest != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfCut.c"
                ,0x5e,"Cnf_Cut_t *Cnf_CutCreate(Cnf_Man_t *, Aig_Obj_t *)");
}

Assistant:

Cnf_Cut_t * Cnf_CutCreate( Cnf_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCutBest;
    Cnf_Cut_t * pCut;
    unsigned * pTruth;
    assert( Aig_ObjIsNode(pObj) );
    pCutBest = Dar_ObjBestCut( pObj );
    assert( pCutBest != NULL );
    assert( pCutBest->nLeaves <= 4 );
    pCut = Cnf_CutAlloc( p, pCutBest->nLeaves );
    memcpy( pCut->pFanins, pCutBest->pLeaves, sizeof(int) * pCutBest->nLeaves );
    pTruth = Cnf_CutTruth(pCut);
    *pTruth = (pCutBest->uTruth << 16) | pCutBest->uTruth;
    pCut->Cost = Cnf_CutSopCost( p, pCutBest );
    return pCut;
}